

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_t *this;
  bool bVar1;
  type *ptVar2;
  ostream *poVar3;
  long *plVar4;
  mapped_type *pmVar5;
  void *pvVar6;
  long lVar7;
  int iVar8;
  undefined1 local_2e8 [8];
  struct_helper<A> a;
  ostringstream oss;
  undefined7 uStack_2a7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0 [6];
  ios_base local_240 [264];
  undefined1 local_138 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  map2;
  string str;
  holder h;
  undefined1 auStack_d8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  map;
  undefined1 local_88 [32];
  undefined8 local_68;
  undefined1 local_58 [8];
  pointer pvStack_50;
  ostream *local_48;
  allocator_type local_35;
  A local_34 [2];
  A aa;
  
  jsonip::detail::struct_helper<A>::struct_helper((struct_helper<A> *)local_2e8);
  ptVar2 = jsonip::detail::calculate_helper<A>::instance();
  if (ptVar2 == (type *)0x0) {
    __assert_fail("detail::get_helper(aa)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/catedrasaes-umu[P]jsonip/test/test.cpp"
                  ,0x22,"int main(int, char **)");
  }
  str.field_2._8_8_ = local_34;
  ptVar2 = jsonip::detail::calculate_helper<A>::instance();
  a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)local_2a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header._M_node_count,
             "a","");
  (*(ptVar2->super_struct_helper_base).super_helper._vptr_helper[7])
            (auStack_d8,ptVar2,(undefined1 *)((long)&str.field_2 + 8),
             &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      local_2a0) {
    operator_delete((void *)a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,local_2a0[0]._M_allocated_capacity + 1);
  }
  a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)local_2a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header._M_node_count,
             "{}","");
  bVar1 = jsonip::parse<A>(local_34,(char *)a.super_struct_helper_base.accessors._M_t._M_impl.
                                            super__Rb_tree_header._M_node_count,
                           CONCAT71(uStack_2a7,oss));
  if (bVar1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header._M_node_count !=
        local_2a0) {
      operator_delete((void *)a.super_struct_helper_base.accessors._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,
                      local_2a0[0]._M_allocated_capacity + 1);
    }
    a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)local_2a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                _M_node_count,"{\"a\" : 120}","");
    bVar1 = jsonip::parse<A>(local_34,(char *)a.super_struct_helper_base.accessors._M_t._M_impl.
                                              super__Rb_tree_header._M_node_count,
                             CONCAT71(uStack_2a7,oss));
    if (bVar1) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header._M_node_count
          != local_2a0) {
        operator_delete((void *)a.super_struct_helper_base.accessors._M_t._M_impl.
                                super__Rb_tree_header._M_node_count,
                        local_2a0[0]._M_allocated_capacity + 1);
      }
      poVar3 = std::ostream::_M_insert<void_const*>(&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_34[0].a);
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)&std::cout;
      local_2a0[0]._M_allocated_capacity = 0;
      jsonip::detail::struct_helper<A>::write<jsonip::writer<true>>
                ((writer<true> *)
                 &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,local_34);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
      std::ostream::put('\b');
      plVar4 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      auStack_d8 = (undefined1  [8])0x0;
      map._M_t._M_impl._0_8_ = 0;
      map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      auStack_d8 = (undefined1  [8])operator_new(400);
      map._M_t._M_impl._0_8_ = (long)auStack_d8 + 400;
      lVar7 = 0;
      do {
        *(undefined4 *)((long)auStack_d8 + lVar7) = 100;
        lVar7 = lVar7 + 4;
      } while (lVar7 != 400);
      a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)&std::cout;
      local_2a0[0]._M_allocated_capacity = 0;
      map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = map._M_t._M_impl._0_8_;
      jsonip::detail::stl_pushbackable_helper<std::vector<int,std::allocator<int>>>::
      write<jsonip::writer<true>>
                ((writer<true> *)
                 &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,(vector<int,_std::allocator<int>_> *)auStack_d8);
      if (auStack_d8 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_d8,
                        map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ - (long)auStack_d8);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
      std::ostream::put('\b');
      plVar4 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)local_2a0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,"asd","");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_138,100,
               (value_type *)
               &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                _M_node_count,(allocator_type *)local_88);
      auStack_d8 = (undefined1  [8])&std::cout;
      map._M_t._M_impl._0_8_ = map._M_t._M_impl._0_8_ & 0xffffffffffffff00;
      map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      jsonip::detail::
      stl_pushbackable_helper<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::write<jsonip::writer<true>>
                ((writer<true> *)auStack_d8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header._M_node_count
          != local_2a0) {
        operator_delete((void *)a.super_struct_helper_base.accessors._M_t._M_impl.
                                super__Rb_tree_header._M_node_count,
                        local_2a0[0]._M_allocated_capacity + 1);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
      std::ostream::put('\b');
      plVar4 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&map;
      iVar8 = 0;
      map._M_t._M_impl._0_8_ = map._M_t._M_impl._0_8_ & 0xffffffff00000000;
      map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      map2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&map2;
      map2._M_t._M_impl._0_4_ = 0;
      map2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      map2._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      map2._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      this = &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header._M_node_count;
      map2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           map2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
        std::ostream::operator<<((ostream *)this,iVar8);
        std::__cxx11::stringbuf::str();
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                               *)auStack_d8,(key_type *)local_88);
        *pmVar5 = (double)iVar8 * 3.3333333333333335;
        if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
          operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
        std::ios_base::~ios_base(local_240);
        iVar8 = iVar8 + 1;
      } while (iVar8 != 100);
      jsonip::
      write<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>>
                ((ostream *)&std::cout,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                  *)auStack_d8,true);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
      std::ostream::put('\b');
      plVar4 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      std::__cxx11::ostringstream::ostringstream
                ((ostringstream *)
                 &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count);
      jsonip::
      write<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>>
                ((ostream *)
                 &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                  *)auStack_d8,true);
      std::__cxx11::stringbuf::str();
      jsonip::
      parse<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>>
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                  *)local_138,(char *)map2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (size_t)str._M_dataplus._M_p);
      jsonip::
      write<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>>
                ((ostream *)&std::cout,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                  *)local_138,true);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
      std::ostream::put('\b');
      plVar4 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      local_58 = (undefined1  [8])0x0;
      pvStack_50 = (pointer)0x0;
      local_48 = (ostream *)0x0;
      local_58 = (undefined1  [8])operator_new(0x50);
      pvStack_50 = (pointer)((long)local_58 + 0x50);
      lVar7 = 0;
      do {
        *(int *)((long)local_58 + lVar7) = local_34[0].a;
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0x50);
      local_88._0_8_ = &std::cout;
      local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
      local_88._16_8_ = 0;
      local_48 = (ostream *)pvStack_50;
      jsonip::detail::stl_pushbackable_helper<std::vector<A,std::allocator<A>>>::
      write<jsonip::writer<true>>
                ((writer<true> *)local_88,(vector<A,_std::allocator<A>_> *)local_58);
      if (local_58 != (undefined1  [8])0x0) {
        operator_delete((void *)local_58,(long)local_48 - (long)local_58);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
      std::ostream::put('\b');
      plVar4 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pvVar6 = operator_new(0x14);
      lVar7 = 0;
      do {
        *(int *)((long)pvVar6 + lVar7) = local_34[0].a;
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0x14);
      map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pvVar6;
      std::
      vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>
      ::vector((vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>
                *)local_58,0x14,(value_type *)&map._M_t._M_impl.super__Rb_tree_header._M_node_count,
               &local_35);
      local_88._0_8_ = &std::cout;
      local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
      local_88._16_8_ = 0;
      jsonip::detail::
      stl_pushbackable_helper<std::vector<std::vector<A,std::allocator<A>>,std::allocator<std::vector<A,std::allocator<A>>>>>
      ::write<jsonip::writer<true>>
                ((writer<true> *)local_88,
                 (vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>
                  *)local_58);
      std::
      vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>
      ::~vector((vector<std::vector<A,_std::allocator<A>_>,_std::allocator<std::vector<A,_std::allocator<A>_>_>_>
                 *)local_58);
      if (map._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        operator_delete((void *)map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (long)pvVar6 + (0x14 - map._M_t._M_impl.super__Rb_tree_header._M_node_count)
                       );
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
      std::ostream::put('\b');
      plVar4 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      local_88._0_8_ = &std::cout;
      local_88._8_8_ = local_88._8_8_ & 0xffffffffffffff00;
      local_88._16_8_ = 0;
      jsonip::writer<true>::new_string((writer<true> *)local_88,"unsupported type");
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
      std::ostream::put('\b');
      plVar4 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      local_88._16_8_ = 0;
      local_88._24_8_ = 0;
      local_88._0_8_ = (pointer)0x0;
      local_88._8_8_ = (pointer)0x0;
      local_68._0_1_ = false;
      local_68._1_7_ = 0;
      local_58 = (undefined1  [8])&std::cout;
      pvStack_50 = (pointer)((ulong)pvStack_50 & 0xffffffffffffff00);
      local_48 = (ostream *)0x0;
      jsonip::detail::struct_helper<C>::write<jsonip::writer<true>>
                ((writer<true> *)local_58,(C *)local_88);
      if ((pointer)local_88._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_88._8_8_,local_88._24_8_ - local_88._8_8_);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
      std::ostream::put('\b');
      plVar4 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
      std::ostream::put((char)plVar4);
      std::ostream::flush();
      if ((size_type *)map2._M_t._M_impl.super__Rb_tree_header._M_node_count !=
          &str._M_string_length) {
        operator_delete((void *)map2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        str._M_string_length + 1);
      }
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)
                 &a.super_struct_helper_base.accessors._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count);
      std::ios_base::~ios_base(local_240);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   *)local_138);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   *)auStack_d8);
      local_2e8 = (undefined1  [8])&PTR__struct_helper_base_00113ae8;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonip::detail::struct_helper_base::member_accessor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonip::detail::struct_helper_base::member_accessor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonip::detail::struct_helper_base::member_accessor_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonip::detail::struct_helper_base::member_accessor_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonip::detail::struct_helper_base::member_accessor_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonip::detail::struct_helper_base::member_accessor_*>_>_>
                   *)&a);
      return 0;
    }
    __assert_fail("parse(aa, \"{\\\"a\\\" : 120}\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/catedrasaes-umu[P]jsonip/test/test.cpp"
                  ,0x27,"int main(int, char **)");
  }
  __assert_fail("parse(aa, \"{}\")",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/catedrasaes-umu[P]jsonip/test/test.cpp"
                ,0x26,"int main(int, char **)");
}

Assistant:

int main(int argc, char **argv)
{
    typedef detail::struct_helper<A> type_t;
    detail::struct_helper<A> a;
    A aa;
    assert(detail::get_helper(aa));
    holder h(&aa);
    detail::get_helper(aa)->new_child(h, "a");

    assert(parse(aa, "{}"));
    assert(parse(aa, "{\"a\" : 120}"));

    std::cout << (void*)&aa.a << std::endl;
    std::cout << aa.a << std::endl;

    jsonip::write(std::cout, aa);
    std::cout << std::endl << std::endl;

    jsonip::write(std::cout, std::vector<int>(100, 100));
    std::cout << std::endl << std::endl;

    jsonip::write(std::cout, std::vector<std::string>(100, "asd"));
    std::cout << std::endl << std::endl;

    std::map<std::string, double> map, map2;
    for (int i = 0; i < 100; i++)
    {
        std::ostringstream oss;
        oss << i;
        map[oss.str()] = 10.0 / 3.0 * double(i);
    }

    jsonip::write(std::cout, map);
    std::cout << std::endl << std::endl;

    std::ostringstream oss;
    jsonip::write(oss, map);
    const std::string str = oss.str();
    jsonip::parse(map2, str);

    jsonip::write(std::cout, map2);
    std::cout << std::endl << std::endl;

    jsonip::write(std::cout, std::vector<A>(20, aa));
    std::cout << std::endl << std::endl;

    jsonip::write(std::cout,
                  std::vector<std::vector<A> >(20, std::vector<A>(5, aa)));
    std::cout << std::endl << std::endl;

    jsonip::write(std::cout, B());
    std::cout << std::endl << std::endl;

    jsonip::write(std::cout, C());
    std::cout << std::endl << std::endl;

    return 0;
}